

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclConfig.cpp
# Opt level: O2

OclPlatform __thiscall xmrig::OclConfig::platform(OclConfig *this)

{
  bool bVar1;
  EVP_PKEY_CTX *extraout_RDX;
  ulong uVar2;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  size_t sVar3;
  pointer pOVar4;
  char *dst;
  cl_platform_id p_Var5;
  OclPlatform OVar6;
  String vendor;
  String search;
  vector<xmrig::OclPlatform,_std::allocator<xmrig::OclPlatform>_> platforms;
  String SStack_68;
  String local_58;
  _Vector_base<xmrig::OclPlatform,_std::allocator<xmrig::OclPlatform>_> local_48;
  String local_30;
  
  OclPlatform::get();
  if (local_48._M_impl.super__Vector_impl_data._M_start !=
      local_48._M_impl.super__Vector_impl_data._M_finish) {
    if ((this->m_platformVendor).m_size == 0) {
      uVar2 = (ulong)this->m_platformIndex;
      sVar3 = 0;
      p_Var5 = (cl_platform_id)0x0;
      if (uVar2 < (ulong)((long)local_48._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_48._M_impl.super__Vector_impl_data._M_start >> 4)) {
        p_Var5 = local_48._M_impl.super__Vector_impl_data._M_start[uVar2].m_id;
        sVar3 = local_48._M_impl.super__Vector_impl_data._M_start[uVar2].m_index;
      }
      goto LAB_0016d725;
    }
    local_58.m_data = (char *)0x0;
    local_58.m_size = 0;
    String::String(&SStack_68,&this->m_platformVendor);
    String::toUpper(&SStack_68);
    bVar1 = String::isEqual(&SStack_68,"AMD");
    if (bVar1) {
      dst = "Advanced Micro Devices";
      src_00 = extraout_RDX;
LAB_0016d6a5:
      String::copy(&local_58,(EVP_PKEY_CTX *)dst,src_00);
    }
    else {
      dst = "NVIDIA";
      bVar1 = String::isEqual(&SStack_68,"NVIDIA");
      src_00 = extraout_RDX_00;
      if (bVar1) goto LAB_0016d6a5;
      bVar1 = String::isEqual(&SStack_68,"INTEL");
      if (bVar1) {
        dst = "Intel";
        src_00 = src;
        goto LAB_0016d6a5;
      }
      String::copy(&local_58,(EVP_PKEY_CTX *)&this->m_platformVendor,src);
    }
    for (pOVar4 = local_48._M_impl.super__Vector_impl_data._M_start;
        pOVar4 != local_48._M_impl.super__Vector_impl_data._M_finish; pOVar4 = pOVar4 + 1) {
      OclPlatform::vendor((OclPlatform *)&local_30);
      bVar1 = String::contains(&local_30,local_58.m_data);
      String::~String(&local_30);
      if (bVar1) {
        p_Var5 = pOVar4->m_id;
        sVar3 = pOVar4->m_index;
        String::~String(&SStack_68);
        String::~String(&local_58);
        goto LAB_0016d725;
      }
    }
    String::~String(&SStack_68);
    String::~String(&local_58);
  }
  sVar3 = 0;
  p_Var5 = (cl_platform_id)0x0;
LAB_0016d725:
  std::_Vector_base<xmrig::OclPlatform,_std::allocator<xmrig::OclPlatform>_>::~_Vector_base
            (&local_48);
  OVar6.m_index = sVar3;
  OVar6.m_id = p_Var5;
  return OVar6;
}

Assistant:

xmrig::OclPlatform xmrig::OclConfig::platform() const
{
    const auto platforms = OclPlatform::get();
    if (platforms.empty()) {
        return {};
    }

    if (!m_platformVendor.isEmpty()) {
        String search;
        String vendor = m_platformVendor;
        vendor.toUpper();

        if (vendor == kAMD) {
            search = "Advanced Micro Devices";
        }
        else if (vendor == kNVIDIA) {
            search = kNVIDIA;
        }
        else if (vendor == kINTEL) {
            search = "Intel";
        }
        else {
            search = m_platformVendor;
        }

        for (const auto &platform : platforms) {
            if (platform.vendor().contains(search)) {
                return platform;
            }
        }
    }
    else if (m_platformIndex < platforms.size()) {
        return platforms[m_platformIndex];
    }

    return {};
}